

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_parser.h
# Opt level: O2

Ref<embree::XML> __thiscall embree::XML::child(XML *this,string *childID)

{
  pointer pcVar1;
  _func_int **pp_Var2;
  __type _Var3;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  size_t i;
  ulong uVar4;
  string sStack_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  uVar4 = 0;
  while( true ) {
    pcVar1 = childID[4]._M_dataplus._M_p;
    if ((ulong)((long)(childID[4]._M_string_length - (long)pcVar1) >> 3) <= uVar4) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      ParseLocation::str_abi_cxx11_(&sStack_a8,(ParseLocation *)&childID->field_2);
      std::operator+(&local_88,&sStack_a8,": XML node has no child \"");
      std::operator+(&local_68,&local_88,in_RDX);
      std::operator+(&local_48,&local_68,"\"");
      std::runtime_error::runtime_error(this_00,(string *)&local_48);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (*(long *)(pcVar1 + uVar4 * 8) + 0x30),in_RDX);
    if (_Var3) break;
    uVar4 = uVar4 + 1;
  }
  pp_Var2 = *(_func_int ***)(childID[4]._M_dataplus._M_p + uVar4 * 8);
  (this->super_RefCount)._vptr_RefCount = pp_Var2;
  if (pp_Var2 != (_func_int **)0x0) {
    (**(code **)(*pp_Var2 + 0x10))();
  }
  return (Ref<embree::XML>)this;
}

Assistant:

const Ref<XML> child(const std::string& childID) const 
    {
      for (size_t i=0; i<children.size(); i++)
        if (children[i]->name == childID) return children[i];
      THROW_RUNTIME_ERROR (loc.str()+": XML node has no child \"" + childID + "\"");
    }